

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

double __thiscall tri_cc_geom_t::compute_average_length(tri_cc_geom_t *this)

{
  undefined8 *puVar1;
  long lVar2;
  RealScalar RVar3;
  uint uVar4;
  uint uVar5;
  double local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  cellid_t pts [20];
  
  uVar4 = get_num_cells_max_dim(this,0);
  uVar5 = get_num_cells_max_dim(this,1);
  local_e0 = 0.0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    get_cell_points(this,uVar4,pts);
    lVar2 = *(long *)&this->m_cell_pos;
    puVar1 = (undefined8 *)(lVar2 + (long)pts[0] * 0x18);
    local_b8 = *puVar1;
    uStack_b0 = puVar1[1];
    local_a8 = *(undefined8 *)(lVar2 + 0x10 + (long)pts[0] * 0x18);
    puVar1 = (undefined8 *)(lVar2 + (long)pts[1] * 0x18);
    local_d8 = *puVar1;
    uStack_d0 = puVar1[1];
    local_c8 = *(undefined8 *)(lVar2 + 0x10 + (long)pts[1] * 0x18);
    local_a0 = &local_b8;
    local_98 = &local_d8;
    RVar3 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    *)&local_a0);
    local_e0 = local_e0 + RVar3;
  }
  uVar4 = get_num_cells_dim(this,1);
  return local_e0 / (double)uVar4;
}

Assistant:

double tri_cc_geom_t::compute_average_length()
{
  double avg_el = 0;

  for(cellid_t c = get_num_cells_max_dim(0),c_end = get_num_cells_max_dim(1);c != c_end; ++c)
  {
    cellid_t pts[20];

    get_cell_points(c,pts);

    avg_el += (get_cell_position(pts[0])-get_cell_position(pts[1])).norm();
  }

  return avg_el/get_num_cells_dim(1);
}